

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void * cmAddSource(void *arg,void *arg2)

{
  bool bVar1;
  ulong uVar2;
  cmCustomCommand **ppcVar3;
  cmPropertyMap *this;
  _Base_ptr *this_00;
  reference d_00;
  cmCPluginAPISourceFile *this_01;
  mapped_type *ppcVar4;
  cmCPluginAPISourceFile *sf;
  string *d;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmSourceFile *rsf;
  cmCPluginAPISourceFile *osf;
  cmMakefile *mf;
  void *arg2_local;
  void *arg_local;
  
  rsf = (cmSourceFile *)arg2;
  osf = (cmCPluginAPISourceFile *)arg;
  mf = (cmMakefile *)arg2;
  arg2_local = arg;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)cmMakefile::GetOrCreateSource
                            ((cmMakefile *)osf,(string *)((long)&(rsf->Location).Name.field_2 + 8),
                             false,Ambiguous);
    ppcVar3 = &rsf->CustomCommand;
    this = cmSourceFile::GetProperties((cmSourceFile *)__range1);
    cmPropertyMap::operator=(this,(cmPropertyMap *)ppcVar3);
    this_00 = &(rsf->Properties).
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00);
    d = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&d);
      if (!bVar1) break;
      d_00 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
      cmSourceFile::AddDepend((cmSourceFile *)__range1,d_00);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_01 = (cmCPluginAPISourceFile *)operator_new(0xb0);
    cmCPluginAPISourceFile::cmCPluginAPISourceFile(this_01);
    this_01->RealSourceFile = (cmSourceFile *)__range1;
    std::__cxx11::string::operator=
              ((string *)&this_01->FullPath,
               (string *)((rsf->Location).Name.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)&this_01->SourceName,(string *)&(rsf->Location).AmbiguousDirectory);
    std::__cxx11::string::operator=
              ((string *)&this_01->SourceExtension,
               (string *)((rsf->Location).Directory.field_2._M_local_buf + 8));
    ppcVar4 = std::
              map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
              ::operator[](&cmCPluginAPISourceFiles.
                            super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
                           ,(key_type *)&__range1);
    *ppcVar4 = this_01;
    arg_local = this_01;
  }
  else {
    arg_local = (void *)0x0;
  }
  return arg_local;
}

Assistant:

void* CCONV cmAddSource(void* arg, void* arg2)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmCPluginAPISourceFile* osf = static_cast<cmCPluginAPISourceFile*>(arg2);
  if (osf->FullPath.empty()) {
    return nullptr;
  }

  // Create the real cmSourceFile instance and copy over saved information.
  cmSourceFile* rsf = mf->GetOrCreateSource(osf->FullPath);
  rsf->GetProperties() = osf->Properties;
  for (std::string const& d : osf->Depends) {
    rsf->AddDepend(d);
  }

  // Create the proxy for the real source file.
  cmCPluginAPISourceFile* sf = new cmCPluginAPISourceFile;
  sf->RealSourceFile = rsf;
  sf->FullPath = osf->FullPath;
  sf->SourceName = osf->SourceName;
  sf->SourceExtension = osf->SourceExtension;

  // Store the proxy in the map so it can be re-used and deleted later.
  cmCPluginAPISourceFiles[rsf] = sf;
  return sf;
}